

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets.cpp
# Opt level: O1

bool __thiscall TimeOffsets::WarnIfOutOfSync(TimeOffsets *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Warnings *this_00;
  string_view source_file;
  bilingual_str message;
  bool bVar3;
  seconds sVar4;
  Logger *pLVar5;
  seconds args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string log_msg;
  bilingual_str msg;
  _Variant_storage_alias<kernel::Warning,_node::Warning> in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe74 [20];
  undefined1 *puVar7;
  undefined8 in_stack_fffffffffffffe90;
  long in_stack_fffffffffffffe98;
  long *local_158 [2];
  long local_148 [2];
  bilingual_str local_138;
  bilingual_str local_f8 [2];
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sVar4 = Median(this);
  args.__r = (rep)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  0x8000000000000001;
  if (-0x7fffffffffffffff < sVar4.__r) {
    args = sVar4;
  }
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)-args.__r;
  if (0 < args.__r) {
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args.__r;
  }
  if (pbVar6 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x259) {
    ::node::Warnings::Unset(this->m_warnings,(warning_type)in_stack_fffffffffffffe58);
  }
  else {
    paVar1 = &local_138.original.field_2;
    local_138.original._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,
               "Your computer\'s date and time appear to be more than %d minutes out of sync with the network, this may lead to consensus failure. After you\'ve confirmed your computer\'s clock, this message should no longer appear when you restart your node. Without a restart, it should stop showing automatically after you\'ve connected to a sufficient number of new outbound peers, which may take some time. You can inspect the `timeoffset` field of the `getpeerinfo` and `getnetworkinfo` RPC methods to get more info."
               ,"");
    paVar2 = &local_138.translated.field_2;
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_138.translated._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138.translated,
                 "Your computer\'s date and time appear to be more than %d minutes out of sync with the network, this may lead to consensus failure. After you\'ve confirmed your computer\'s clock, this message should no longer appear when you restart your node. Without a restart, it should stop showing automatically after you\'ve connected to a sufficient number of new outbound peers, which may take some time. You can inspect the `timeoffset` field of the `getpeerinfo` and `getnetworkinfo` RPC methods to get more info."
                 ,"");
    }
    else {
      local_58._M_dataplus._M_p =
           "Your computer\'s date and time appear to be more than %d minutes out of sync with the network, this may lead to consensus failure. After you\'ve confirmed your computer\'s clock, this message should no longer appear when you restart your node. Without a restart, it should stop showing automatically after you\'ve connected to a sufficient number of new outbound peers, which may take some time. You can inspect the `timeoffset` field of the `getpeerinfo` and `getnetworkinfo` RPC methods to get more info."
      ;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_138.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_58
                );
    }
    local_58._M_dataplus._M_p = (pointer)0xa;
    tinyformat::format<long>(local_f8,&local_138,(long *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.translated._M_dataplus._M_p != paVar2) {
      operator_delete(local_138.translated._M_dataplus._M_p,
                      local_138.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.original._M_dataplus._M_p != paVar1) {
      operator_delete(local_138.original._M_dataplus._M_p,
                      CONCAT71(local_138.original.field_2._M_allocated_capacity._1_7_,
                               local_138.original.field_2._M_local_buf[0]) + 1);
    }
    pLVar5 = LogInstance();
    bVar3 = BCLog::Logger::Enabled(pLVar5);
    if (bVar3) {
      local_138.original._M_string_length = 0;
      local_138.original.field_2._M_local_buf[0] = '\0';
      local_138.original._M_dataplus._M_p = (pointer)paVar1;
      tinyformat::format<std::__cxx11::string>
                (&local_58,(tinyformat *)0x8aab4b,(char *)local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args.__r);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_138.original,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      pLVar5 = LogInstance();
      local_58._M_dataplus._M_p = (pointer)0x5d;
      local_58._M_string_length = 0x82f39b;
      in_stack_fffffffffffffe58._M_u = (_Variadic_union<kernel::Warning,_node::Warning>)0x5d;
      in_stack_fffffffffffffe58._M_index = '\0';
      in_stack_fffffffffffffe58._5_3_ = 0;
      in_stack_fffffffffffffe60 =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/timeoffsets.cpp"
      ;
      in_stack_fffffffffffffe70 = 3;
      in_stack_fffffffffffffe68 = 0xffffffffffffffff;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/timeoffsets.cpp"
      ;
      source_file._M_len = 0x5d;
      str._M_str = local_138.original._M_dataplus._M_p;
      str._M_len = local_138.original._M_string_length;
      logging_function._M_str = "WarnIfOutOfSync";
      logging_function._M_len = 0xf;
      BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0x3f,ALL,Warning);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.original._M_dataplus._M_p != paVar1) {
        operator_delete(local_138.original._M_dataplus._M_p,
                        CONCAT71(local_138.original.field_2._M_allocated_capacity._1_7_,
                                 local_138.original.field_2._M_local_buf[0]) + 1);
      }
    }
    this_00 = this->m_warnings;
    puVar7 = &stack0xfffffffffffffe98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xfffffffffffffe88,local_f8[0].original._M_dataplus._M_p,
               local_f8[0].original._M_dataplus._M_p + local_f8[0].original._M_string_length);
    local_158[0] = local_148;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_158,local_f8[0].translated._M_dataplus._M_p,
               local_f8[0].translated._M_dataplus._M_p + local_f8[0].translated._M_string_length);
    message.original._M_string_length = in_stack_fffffffffffffe68;
    message.original._M_dataplus._M_p = in_stack_fffffffffffffe60;
    message.original.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe70;
    message._20_20_ = in_stack_fffffffffffffe74;
    message.translated._M_string_length = (size_type)puVar7;
    message.translated.field_2._M_allocated_capacity = in_stack_fffffffffffffe90;
    message.translated.field_2._8_8_ = in_stack_fffffffffffffe98;
    ::node::Warnings::Set(this_00,(warning_type)in_stack_fffffffffffffe58,message);
    if (local_158[0] != local_148) {
      operator_delete(local_158[0],local_148[0] + 1);
    }
    if (puVar7 != &stack0xfffffffffffffe98) {
      operator_delete(puVar7,in_stack_fffffffffffffe98 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8[0].translated._M_dataplus._M_p != &local_f8[0].translated.field_2) {
      operator_delete(local_f8[0].translated._M_dataplus._M_p,
                      local_f8[0].translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8[0].original._M_dataplus._M_p != &local_f8[0].original.field_2) {
      operator_delete(local_f8[0].original._M_dataplus._M_p,
                      local_f8[0].original.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x258 < pbVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool TimeOffsets::WarnIfOutOfSync() const
{
    // when median == std::numeric_limits<int64_t>::min(), calling std::chrono::abs is UB
    auto median{std::max(Median(), std::chrono::seconds(std::numeric_limits<int64_t>::min() + 1))};
    if (std::chrono::abs(median) <= WARN_THRESHOLD) {
        m_warnings.Unset(node::Warning::CLOCK_OUT_OF_SYNC);
        return false;
    }

    bilingual_str msg{strprintf(_(
        "Your computer's date and time appear to be more than %d minutes out of sync with the network, "
        "this may lead to consensus failure. After you've confirmed your computer's clock, this message "
        "should no longer appear when you restart your node. Without a restart, it should stop showing "
        "automatically after you've connected to a sufficient number of new outbound peers, which may "
        "take some time. You can inspect the `timeoffset` field of the `getpeerinfo` and `getnetworkinfo` "
        "RPC methods to get more info."
    ), Ticks<std::chrono::minutes>(WARN_THRESHOLD))};
    LogWarning("%s\n", msg.original);
    m_warnings.Set(node::Warning::CLOCK_OUT_OF_SYNC, msg);
    return true;
}